

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stats.cc
# Opt level: O0

void WriteCountsWithImmediates(Stream *stream,OpcodeInfoCounts *counts)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  back_insert_iterator<std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>
  bVar4;
  iterator iVar5;
  iterator iVar6;
  reference __in;
  type *this;
  type *ptVar7;
  type *count;
  type *info;
  __normal_iterator<std::pair<wabt::OpcodeInfo,_unsigned_long>_*,_std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>
  local_88;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  *__range1;
  undefined1 local_30 [8];
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  sorted;
  OpcodeInfoCounts *counts_local;
  Stream *stream_local;
  
  sorted.
  super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)counts;
  std::
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ::vector((vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
            *)local_30);
  cVar2 = std::
          map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
          ::begin((map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
                   *)sorted.
                     super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cVar3 = std::
          map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
          ::end((map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
                 *)sorted.
                   super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar4 = std::
          back_inserter<std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>
                    ((vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                      *)local_30);
  std::
  copy_if<std::_Rb_tree_const_iterator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::back_insert_iterator<std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>,WithinCutoff<std::pair<wabt::OpcodeInfo,unsigned_long>>>
            (cVar2._M_node,cVar3._M_node,bVar4.container);
  iVar5 = std::
          vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
          ::begin((vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                   *)local_30);
  iVar6 = std::
          vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
          ::end((vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                 *)local_30);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::pair<wabt::OpcodeInfo,unsigned_long>*,std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>,SortByCountDescending<std::pair<wabt::OpcodeInfo,unsigned_long>>>
            (iVar5._M_current,iVar6._M_current);
  __end1 = std::
           vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
           ::begin((vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                    *)local_30);
  local_88._M_current =
       (pair<wabt::OpcodeInfo,_unsigned_long> *)
       std::
       vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
       ::end((vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
              *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_88);
    if (!bVar1) break;
    __in = __gnu_cxx::
           __normal_iterator<std::pair<wabt::OpcodeInfo,_unsigned_long>_*,_std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>
           ::operator*(&__end1);
    this = std::get<0ul,wabt::OpcodeInfo,unsigned_long>(__in);
    ptVar7 = std::get<1ul,wabt::OpcodeInfo,unsigned_long>(__in);
    wabt::OpcodeInfo::Write(this,stream);
    wabt::Stream::Writef(stream,"%s%zd\n",s_separator,*ptVar7);
    __gnu_cxx::
    __normal_iterator<std::pair<wabt::OpcodeInfo,_unsigned_long>_*,_std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ::~vector((vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
             *)local_30);
  return;
}

Assistant:

void WriteCountsWithImmediates(Stream& stream, const OpcodeInfoCounts& counts) {
  // Remove const from the key type so we can sort below.
  using OpcodeInfoCountPair =
      std::pair<std::remove_const<OpcodeInfoCounts::key_type>::type,
                OpcodeInfoCounts::mapped_type>;

  std::vector<OpcodeInfoCountPair> sorted;
  std::copy_if(counts.begin(), counts.end(), std::back_inserter(sorted),
               WithinCutoff<OpcodeInfoCountPair>());

  // Use a stable sort to keep the elements with the same count in opcode info
  // order (since the OpcodeInfoCounts map is sorted).
  std::stable_sort(sorted.begin(), sorted.end(),
                   SortByCountDescending<OpcodeInfoCountPair>());

  for (auto& [info, count] : sorted) {
    info.Write(stream);
    stream.Writef("%s%" PRIzd "\n", s_separator, count);
  }
}